

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

bool duckdb::CheckIfParamIsEmpty
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *param
               )

{
  LogicalTypeId LVar1;
  int iVar2;
  pointer pEVar3;
  type pBVar4;
  BinderException *this;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  local_98;
  LogicalType local_90;
  vector<duckdb::Value,_true> local_78;
  Value local_58;
  
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (param);
  LVar1 = (pEVar3->return_type).id_;
  if (LVar1 == LIST) {
    LogicalType::LogicalType(&local_90,INTEGER);
    local_78.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Value::LIST(&local_58,&local_90,&local_78);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value>((duckdb *)&local_98,&local_58);
    Value::~Value(&local_58);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_78);
    LogicalType::~LogicalType(&local_90);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(param);
    pBVar4 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
             ::operator*((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                          *)&local_98);
    iVar2 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[10])(pEVar3,pBVar4);
    if ((char)iVar2 == '\0') {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"The upper and lower bounds of the slice must be a BIGINT",
                 (allocator *)&local_90);
      BinderException::BinderException(this,(string *)&local_58);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_98._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
        .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
         )0x0) {
      (**(code **)(*(long *)local_98._M_t.
                            super__Tuple_impl<0UL,_duckdb::BoundConstantExpression_*,_std::default_delete<duckdb::BoundConstantExpression>_>
                            .super__Head_base<0UL,_duckdb::BoundConstantExpression_*,_false>.
                            _M_head_impl + 8))();
    }
  }
  return LVar1 == LIST;
}

Assistant:

static bool CheckIfParamIsEmpty(duckdb::unique_ptr<duckdb::Expression> &param) {
	bool is_empty = false;
	if (param->return_type.id() == LogicalTypeId::LIST) {
		auto empty_list = make_uniq<BoundConstantExpression>(Value::LIST(LogicalType::INTEGER, vector<Value>()));
		is_empty = param->Equals(*empty_list);
		if (!is_empty) {
			// if the param is not empty, the user has entered a list instead of a BIGINT
			throw BinderException("The upper and lower bounds of the slice must be a BIGINT");
		}
	}
	return is_empty;
}